

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O1

void triangularToSquareHessian
               (HighsHessian *hessian,vector<int,_std::allocator<int>_> *start,
               vector<int,_std::allocator<int>_> *index,
               vector<double,_std::allocator<double>_> *value)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer pdVar8;
  ulong uVar9;
  size_type __new_size;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  vector<int,_std::allocator<int>_> length;
  vector<int,_std::allocator<int>_> local_58;
  value_type_conflict2 local_34;
  
  uVar1 = hessian->dim_;
  uVar9 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)((ulong)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (start,1,(value_type_conflict2 *)&local_58);
  }
  else {
    iVar10 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9];
    std::vector<int,_std::allocator<int>_>::resize(start,uVar9 + 1);
    __new_size = (size_type)(int)(iVar10 * 2 - uVar1);
    std::vector<int,_std::allocator<int>_>::resize(index,__new_size);
    std::vector<double,_std::allocator<double>_>::resize(value,__new_size);
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_34 = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign(&local_58,uVar9,&local_34);
    piVar3 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = 0;
    do {
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar12] =
           local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar12] + 1;
      uVar11 = uVar12 + 1;
      if (piVar3[uVar12] + 1 < piVar3[uVar12 + 1]) {
        lVar13 = (long)piVar3[uVar12] + 1;
        do {
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[piVar4[lVar13]] =
               local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[piVar4[lVar13]] + 1;
          local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar12] =
               local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12] + 1;
          lVar13 = lVar13 + 1;
        } while (lVar13 < piVar3[uVar11]);
      }
      uVar12 = uVar11;
    } while (uVar11 != uVar9);
    piVar3 = (start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    *piVar3 = 0;
    uVar9 = 1;
    if (1 < (int)uVar1) {
      uVar9 = (ulong)uVar1;
    }
    iVar10 = 0;
    uVar12 = 0;
    do {
      iVar10 = iVar10 + local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar12];
      piVar3[uVar12 + 1] = iVar10;
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
    piVar4 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar7 = (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 1;
    if (1 < (int)uVar1) {
      uVar9 = (ulong)uVar1;
    }
    uVar12 = 0;
    do {
      iVar10 = piVar4[uVar12];
      iVar2 = piVar3[uVar12];
      piVar6[iVar2] = piVar5[iVar10];
      pdVar8[iVar2] = pdVar7[iVar10];
      piVar3[uVar12] = piVar3[uVar12] + 1;
      uVar11 = uVar12 + 1;
      if (piVar4[uVar12] + 1 < piVar4[uVar12 + 1]) {
        lVar13 = (long)piVar4[uVar12] + 1;
        do {
          iVar10 = piVar5[lVar13];
          iVar2 = piVar3[iVar10];
          piVar6[iVar2] = (int)uVar12;
          pdVar8[iVar2] = pdVar7[lVar13];
          piVar3[iVar10] = piVar3[iVar10] + 1;
          iVar2 = piVar3[uVar12];
          piVar6[iVar2] = iVar10;
          pdVar8[iVar2] = pdVar7[lVar13];
          piVar3[uVar12] = piVar3[uVar12] + 1;
          lVar13 = lVar13 + 1;
        } while (lVar13 < piVar4[uVar11]);
      }
      uVar12 = uVar11;
    } while (uVar11 != uVar9);
    *piVar3 = 0;
    uVar9 = 1;
    if (1 < (int)uVar1) {
      uVar9 = (ulong)uVar1;
    }
    iVar10 = 0;
    uVar12 = 0;
    do {
      iVar10 = iVar10 + local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar12];
      piVar3[uVar12 + 1] = iVar10;
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
    if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void triangularToSquareHessian(const HighsHessian& hessian,
                               vector<HighsInt>& start, vector<HighsInt>& index,
                               vector<double>& value) {
  const HighsInt dim = hessian.dim_;
  if (dim <= 0) {
    start.assign(1, 0);
    return;
  }
  assert(hessian.format_ == HessianFormat::kTriangular);
  const HighsInt nnz = hessian.start_[dim];
  const HighsInt square_nnz = nnz + (nnz - dim);
  start.resize(dim + 1);
  index.resize(square_nnz);
  value.resize(square_nnz);
  vector<HighsInt> length;
  length.assign(dim, 0);
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    HighsInt iRow = hessian.index_[hessian.start_[iCol]];
    assert(iRow == iCol);
    length[iCol]++;
    for (HighsInt iEl = hessian.start_[iCol] + 1;
         iEl < hessian.start_[iCol + 1]; iEl++) {
      HighsInt iRow = hessian.index_[iEl];
      assert(iRow > iCol);
      length[iRow]++;
      length[iCol]++;
    }
  }
  start[0] = 0;
  for (HighsInt iCol = 0; iCol < dim; iCol++)
    start[iCol + 1] = start[iCol] + length[iCol];
  assert(square_nnz == start[dim]);
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    HighsInt iEl = hessian.start_[iCol];
    HighsInt iRow = hessian.index_[iEl];
    HighsInt toEl = start[iCol];
    index[toEl] = iRow;
    value[toEl] = hessian.value_[iEl];
    start[iCol]++;
    for (HighsInt iEl = hessian.start_[iCol] + 1;
         iEl < hessian.start_[iCol + 1]; iEl++) {
      HighsInt iRow = hessian.index_[iEl];
      HighsInt toEl = start[iRow];
      index[toEl] = iCol;
      value[toEl] = hessian.value_[iEl];
      start[iRow]++;
      toEl = start[iCol];
      index[toEl] = iRow;
      value[toEl] = hessian.value_[iEl];
      start[iCol]++;
    }
  }
  start[0] = 0;
  for (HighsInt iCol = 0; iCol < dim; iCol++)
    start[iCol + 1] = start[iCol] + length[iCol];
}